

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpub.cpp
# Opt level: O0

void __thiscall zmq::xpub_t::~xpub_t(xpub_t *this)

{
  xpub_t *in_stack_00000010;
  
  ~xpub_t(in_stack_00000010);
  return;
}

Assistant:

zmq::xpub_t::~xpub_t ()
{
    _welcome_msg.close ();
    for (std::deque<metadata_t *>::iterator it = _pending_metadata.begin (),
                                            end = _pending_metadata.end ();
         it != end; ++it)
        if (*it && (*it)->drop_ref ())
            LIBZMQ_DELETE (*it);
}